

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_parser(void)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  xmlParserCtxtPtr pxVar19;
  ulong uVar20;
  undefined8 uVar21;
  size_t sVar22;
  xmlDocPtr pxVar23;
  xmlParserInputBufferPtr pxVar24;
  xmlNodePtr pxVar25;
  xmlParserInputBufferPtr pxVar26;
  long lVar27;
  xmlParserInputBufferPtr pxVar28;
  xmlNodePtr pxVar29;
  ulong uVar30;
  long lVar31;
  undefined8 uVar32;
  int nr;
  char *pcVar33;
  undefined8 uVar34;
  int n_options;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  uint *puVar38;
  ulong uVar39;
  int n_ctxt;
  uint uVar40;
  int *piVar41;
  ulong in_RSI;
  char *pcVar42;
  int *piVar43;
  undefined *puVar44;
  int *len;
  undefined8 *puVar45;
  int *piVar46;
  int test_ret;
  int iVar47;
  bool bVar48;
  int test_ret_22;
  uint uVar49;
  undefined4 uVar50;
  undefined **ppuVar51;
  int *piVar52;
  int n_options_2;
  undefined4 *puVar53;
  int test_ret_10;
  int test_ret_9;
  int test_ret_11;
  int test_ret_13;
  int test_ret_2;
  int test_ret_3;
  int test_ret_18;
  int test_ret_8;
  int test_ret_24;
  int test_ret_26;
  int test_ret_1;
  int test_ret_5;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 *local_90;
  uint local_7c;
  undefined8 *local_78;
  undefined8 local_70;
  uint local_68;
  int local_64;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing parser : 61 of 70 functions ...");
  }
  uVar40 = 0;
  iVar47 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)in_RSI);
    xmlByteConsumed(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlByteConsumed",(ulong)(uint)(iVar4 - iVar3));
      iVar47 = iVar47 + 1;
      in_RSI = (ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlClearNodeInfoSeq(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlClearNodeInfoSeq");
    in_RSI = 0;
    printf(" %d");
    putchar(10);
  }
  local_7c = (uint)(iVar3 != iVar4);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)in_RSI);
    xmlClearParserCtxt(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlClearParserCtxt",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      in_RSI = (ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  puVar45 = &DAT_00165d70;
  uVar40 = 0;
  local_68 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar40 < 4) {
      uVar21 = *puVar45;
    }
    else {
      uVar21 = 0;
    }
    xmlCreateDocParserCtxt(uVar21);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateDocParserCtxt",(ulong)(uint)(iVar5 - iVar4));
      local_68 = local_68 + 1;
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar40 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar4 = 0;
    do {
      uVar40 = 0;
      do {
        uVar20 = 0;
        do {
          piVar46 = (int *)0x0;
          ppuVar51 = &PTR_anon_var_dwarf_658_00165d30;
          do {
            uVar35 = (uint)piVar46;
            iVar5 = xmlMemBlocks();
            if (bVar48) {
              uVar21 = __xmlDefaultSAXHandler();
            }
            else {
              uVar21 = 0;
            }
            pcVar42 = (char *)&call_tests;
            if (iVar4 != 0) {
              if (iVar4 == 1) {
                pcVar42 = (char *)0xffffffffffffffff;
              }
              else {
                pcVar42 = (char *)0x0;
              }
            }
            if (uVar40 == 0) {
              bVar2 = false;
              pcVar33 = "foo";
            }
            else if (uVar40 == 2) {
              bVar2 = false;
              pcVar33 = "test/ent2";
            }
            else if (uVar40 == 1) {
              bVar2 = false;
              pcVar33 = "<foo/>";
            }
            else {
              bVar2 = true;
              pcVar33 = (char *)0x0;
            }
            iVar6 = -1;
            if ((uint)uVar20 < 4) {
              iVar6 = (&DAT_0016343c)[uVar20];
            }
            if (uVar35 < 5) {
              puVar44 = *ppuVar51;
            }
            else {
              puVar44 = (undefined *)0x0;
            }
            if ((bVar2) || (sVar22 = strlen(pcVar33), iVar6 <= (int)sVar22 + 1)) {
              xmlCreatePushParserCtxt(uVar21,pcVar42,pcVar33,iVar6,puVar44);
              xmlFreeParserCtxt();
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar6 - iVar5));
                local_64 = local_64 + 1;
                printf(" %d",local_58);
                printf(" %d",iVar4);
                printf(" %d",(ulong)uVar40);
                printf(" %d",uVar20);
                printf(" %d");
                putchar(10);
                pcVar42 = (char *)piVar46;
              }
            }
            uVar35 = uVar35 + 1;
            piVar46 = (int *)(ulong)uVar35;
            ppuVar51 = ppuVar51 + 1;
          } while (uVar35 != 6);
          uVar35 = (uint)uVar20 + 1;
          uVar20 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar40 = uVar40 + 1;
      } while (uVar40 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    local_58 = 1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  local_48 = &DAT_00165d90;
  iVar4 = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      uVar20 = 0;
      do {
        uVar30 = 0;
        do {
          puVar53 = &DAT_0016342c;
          piVar46 = (int *)0x0;
          do {
            iVar6 = (int)pcVar42;
            iVar5 = xmlMemBlocks();
            pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar6);
            if (uVar35 < 4) {
              pcVar42 = (char *)(&DAT_00165d70)[uVar35];
            }
            else {
              pcVar42 = (char *)0x0;
            }
            if ((uint)uVar20 < 7) {
              uVar21 = (&DAT_00165d90)[uVar20];
            }
            else {
              uVar21 = 0;
            }
            if ((uint)uVar30 < 3) {
              uVar32 = (&DAT_00165d58)[uVar30];
            }
            else {
              uVar32 = 0;
            }
            uVar50 = 0x200;
            uVar36 = (uint)piVar46;
            if (uVar36 < 4) {
              uVar50 = *puVar53;
            }
            pxVar23 = (xmlDocPtr)xmlCtxtReadDoc(pxVar19,pcVar42,uVar21,uVar32,uVar50);
            if (api_doc != pxVar23) {
              xmlFreeDoc(pxVar23);
            }
            call_tests = call_tests + 1;
            if (pxVar19 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar19);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCtxtReadDoc",(ulong)(uint)(iVar6 - iVar5));
              iVar4 = iVar4 + 1;
              printf(" %d",(ulong)uVar40);
              printf(" %d",(ulong)uVar35);
              printf(" %d",uVar20);
              printf(" %d",uVar30);
              printf(" %d");
              putchar(10);
              pcVar42 = (char *)piVar46;
            }
            uVar36 = uVar36 + 1;
            piVar46 = (int *)(ulong)uVar36;
            puVar53 = puVar53 + 1;
          } while (uVar36 != 5);
          uVar36 = (uint)uVar30 + 1;
          uVar30 = (ulong)uVar36;
        } while (uVar36 != 4);
        uVar36 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar36;
      } while (uVar36 != 8);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 5);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      uVar20 = 0;
      do {
        puVar53 = &DAT_0016342c;
        piVar46 = (int *)0x0;
        do {
          iVar7 = (int)pcVar42;
          iVar6 = xmlMemBlocks();
          pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar7);
          if (uVar35 < 7) {
            pcVar42 = (char *)(&DAT_00165d90)[uVar35];
          }
          else {
            pcVar42 = (char *)0x0;
          }
          if ((uint)uVar20 < 3) {
            uVar21 = (&DAT_00165d58)[uVar20];
          }
          else {
            uVar21 = 0;
          }
          uVar50 = 0x200;
          uVar36 = (uint)piVar46;
          if (uVar36 < 4) {
            uVar50 = *puVar53;
          }
          pxVar23 = (xmlDocPtr)xmlCtxtReadFile(pxVar19,pcVar42,uVar21,uVar50);
          if (api_doc != pxVar23) {
            xmlFreeDoc(pxVar23);
          }
          call_tests = call_tests + 1;
          if (pxVar19 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar19);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCtxtReadFile",(ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar40);
            printf(" %d",(ulong)uVar35);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            pcVar42 = (char *)piVar46;
          }
          uVar36 = uVar36 + 1;
          piVar46 = (int *)(ulong)uVar36;
          puVar53 = puVar53 + 1;
        } while (uVar36 != 5);
        uVar36 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar36;
      } while (uVar36 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 8);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  iVar47 = local_7c + iVar47 + iVar3 + local_68 + local_64;
  function_tests = function_tests + 1;
  local_68 = 0;
  uVar40 = 0;
  do {
    iVar3 = 0;
    do {
      uVar35 = 0;
      do {
        uVar20 = 0;
        do {
          uVar36 = 0;
          do {
            piVar46 = (int *)0x0;
            do {
              iVar7 = (int)pcVar42;
              iVar6 = xmlMemBlocks();
              pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar7);
              if (iVar3 == 0) {
                bVar2 = false;
                pcVar42 = "foo";
              }
              else if (iVar3 == 2) {
                bVar2 = false;
                pcVar42 = "test/ent2";
              }
              else if (iVar3 == 1) {
                bVar2 = false;
                pcVar42 = "<foo/>";
              }
              else {
                bVar2 = true;
                pcVar42 = (char *)0x0;
              }
              iVar7 = -1;
              if (uVar35 < 4) {
                iVar7 = (&DAT_0016343c)[uVar35];
              }
              iVar8 = (int)piVar46;
              if ((bVar2) || (sVar22 = strlen(pcVar42), iVar7 <= (int)sVar22 + 1)) {
                pxVar23 = (xmlDocPtr)xmlCtxtReadMemory();
                if (api_doc != pxVar23) {
                  xmlFreeDoc(pxVar23);
                }
                call_tests = call_tests + 1;
                if (pxVar19 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt(pxVar19);
                }
                xmlResetLastError();
                iVar7 = xmlMemBlocks();
                if (iVar6 != iVar7) {
                  iVar7 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlCtxtReadMemory",(ulong)(uint)(iVar7 - iVar6)
                        );
                  local_68 = local_68 + 1;
                  printf(" %d",(ulong)uVar40);
                  printf(" %d",iVar3);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",uVar20);
                  printf(" %d",(ulong)uVar36);
                  printf(" %d");
                  putchar(10);
                  pcVar42 = (char *)piVar46;
                }
              }
              uVar49 = iVar8 + 1;
              piVar46 = (int *)(ulong)uVar49;
            } while (uVar49 != 5);
            uVar36 = uVar36 + 1;
          } while (uVar36 != 4);
          uVar36 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar36;
        } while (uVar36 != 8);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  uVar40 = 0;
  local_64 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pcVar42);
    xmlCtxtReset(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar3 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtReset",(ulong)(uint)(iVar6 - iVar3));
      local_64 = local_64 + 1;
      pcVar42 = (char *)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar40 = 0;
  do {
    iVar6 = 0;
    do {
      uVar20 = 0;
      do {
        uVar35 = 0;
        do {
          piVar46 = (int *)0x0;
          puVar45 = &DAT_00165d58;
          do {
            iVar7 = xmlMemBlocks();
            pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pcVar42);
            if (iVar6 == 0) {
              bVar2 = false;
              pcVar33 = "foo";
            }
            else if (iVar6 == 2) {
              bVar2 = false;
              pcVar33 = "test/ent2";
            }
            else if (iVar6 == 1) {
              bVar2 = false;
              pcVar33 = "<foo/>";
            }
            else {
              bVar2 = true;
              pcVar33 = (char *)0x0;
            }
            iVar8 = -1;
            if ((uint)uVar20 < 4) {
              iVar8 = (&DAT_0016343c)[uVar20];
            }
            if (uVar35 < 7) {
              uVar21 = (&DAT_00165d90)[uVar35];
            }
            else {
              uVar21 = 0;
            }
            uVar36 = (uint)piVar46;
            if (uVar36 < 3) {
              uVar32 = *puVar45;
            }
            else {
              uVar32 = 0;
            }
            if ((bVar2) || (sVar22 = strlen(pcVar33), iVar8 <= (int)sVar22 + 1)) {
              xmlCtxtResetPush(pxVar19,pcVar33,iVar8,uVar21,uVar32);
              call_tests = call_tests + 1;
              pcVar42 = pcVar33;
              if (pxVar19 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar19);
                pcVar42 = pcVar33;
              }
              xmlResetLastError();
              iVar8 = xmlMemBlocks();
              if (iVar7 != iVar8) {
                iVar8 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCtxtResetPush",(ulong)(uint)(iVar8 - iVar7));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)uVar40);
                printf(" %d",iVar6);
                printf(" %d",uVar20);
                printf(" %d",(ulong)uVar35);
                printf(" %d");
                putchar(10);
                pcVar42 = (char *)piVar46;
              }
            }
            uVar36 = uVar36 + 1;
            piVar46 = (int *)(ulong)uVar36;
            puVar45 = puVar45 + 1;
          } while (uVar36 != 4);
          uVar35 = uVar35 + 1;
        } while (uVar35 != 8);
        uVar35 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar35;
      } while (uVar35 != 4);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar40 = 0;
  do {
    puVar38 = &DAT_0016342c;
    piVar46 = (int *)0x0;
    do {
      iVar8 = (int)pcVar42;
      iVar7 = xmlMemBlocks();
      pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar8);
      pcVar42 = (char *)0x200;
      uVar35 = (uint)piVar46;
      if (uVar35 < 4) {
        pcVar42 = (char *)(ulong)*puVar38;
      }
      xmlCtxtUseOptions(pxVar19);
      call_tests = call_tests + 1;
      if (pxVar19 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar19);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCtxtUseOptions",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar40);
        printf(" %d");
        putchar(10);
        pcVar42 = (char *)piVar46;
      }
      uVar35 = uVar35 + 1;
      piVar46 = (int *)(ulong)uVar35;
      puVar38 = puVar38 + 1;
    } while (uVar35 != 5);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  iVar47 = iVar47 + iVar4 + iVar5 + local_68 + local_64;
  function_tests = function_tests + 1;
  local_90._0_4_ = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      piVar46 = (int *)0x0;
      bVar2 = true;
      do {
        bVar48 = bVar2;
        iVar5 = (int)pcVar42;
        iVar4 = xmlMemBlocks();
        pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar5);
        if (uVar35 < 3) {
          pcVar42 = (char *)(&DAT_00165d58)[uVar35];
        }
        else {
          pcVar42 = (char *)0x0;
        }
        xmlGetFeature(pxVar19,pcVar42,0);
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetFeature",(ulong)(uint)(iVar5 - iVar4));
          local_90._0_4_ = (int)local_90 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",(ulong)uVar35);
          printf(" %d");
          putchar(10);
          pcVar42 = (char *)piVar46;
        }
        piVar46 = (int *)0x1;
        bVar2 = false;
      } while (bVar48);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    piVar46 = (int *)0x0;
    if (bVar48) {
      piVar46 = inttab;
    }
    iVar5 = xmlMemBlocks();
    pxVar24 = (xmlParserInputBufferPtr)0x0;
    xmlGetFeaturesList(piVar46);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar5 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetFeaturesList",(ulong)(uint)(iVar7 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      pxVar24 = (xmlParserInputBufferPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  uVar40 = 0xffffffff;
  iVar5 = 0;
  do {
    iVar7 = xmlMemBlocks();
    uVar50 = 0;
    if (uVar40 < 3) {
      uVar50 = (&DAT_001551e0)[uVar40];
    }
    uVar40 = uVar40 + 1;
    xmlHasFeature(uVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasFeature",(ulong)(uint)(iVar8 - iVar7));
      iVar5 = iVar5 + 1;
      pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar7 = 0;
    do {
      uVar40 = 0;
      puVar53 = &DAT_00155228;
      do {
        iVar8 = (int)pxVar24;
        if (bVar48) {
          uVar21 = __xmlDefaultSAXHandler();
        }
        else {
          uVar21 = 0;
        }
        pxVar24 = gen_xmlParserInputBufferPtr(iVar7,iVar8);
        uVar50 = 0xffffffff;
        if (uVar40 < 3) {
          uVar50 = *puVar53;
        }
        pxVar25 = (xmlNodePtr)xmlIOParseDTD(uVar21,pxVar24,uVar50);
        desret_xmlNodePtr(pxVar25);
        call_tests = call_tests + 1;
        xmlFreeParserInputBuffer(0);
        xmlResetLastError();
        uVar40 = uVar40 + 1;
        puVar53 = puVar53 + 1;
      } while (uVar40 != 4);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 8);
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlInitNodeInfoSeq(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlInitNodeInfoSeq");
    pxVar24 = (xmlParserInputBufferPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlInitParser();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    pxVar24 = (xmlParserInputBufferPtr)(ulong)(uint)(iVar11 - iVar9);
    printf("Leak of %d blocks found in xmlInitParser");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pxVar24);
    xmlInitParserCtxt(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlInitParserCtxt",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar12 = 0;
  puVar53 = &DAT_0016343c;
  do {
    iVar13 = xmlMemBlocks();
    xmlKeepBlanksDefault(*puVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlKeepBlanksDefault",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar53 = puVar53 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  puVar53 = &DAT_0016343c;
  uVar40 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    xmlLineNumbersDefault(*puVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLineNumbersDefault",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar53 = puVar53 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar40 = 0;
  do {
    uVar20 = 0;
    do {
      uVar35 = 0;
      do {
        iVar16 = (int)pxVar24;
        iVar15 = xmlMemBlocks();
        if (uVar40 < 7) {
          uVar21 = (&DAT_00165d90)[uVar40];
        }
        else {
          uVar21 = 0;
        }
        if ((uint)uVar20 < 3) {
          pxVar24 = (xmlParserInputBufferPtr)(&DAT_00165d58)[uVar20];
        }
        else {
          pxVar24 = (xmlParserInputBufferPtr)0x0;
        }
        pxVar19 = gen_xmlParserCtxtPtr(uVar35,iVar16);
        uVar21 = xmlLoadExternalEntity(uVar21,pxVar24,pxVar19);
        xmlFreeInputStream(uVar21);
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlLoadExternalEntity",(ulong)(uint)(iVar16 - iVar15));
          iVar14 = iVar14 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",uVar20);
          pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar35;
          printf(" %d");
          putchar(10);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 != 3);
      uVar35 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar35;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 8);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      pxVar28 = (xmlParserInputBufferPtr)0x0;
      puVar53 = &DAT_00155228;
      do {
        iVar17 = (int)pxVar24;
        iVar16 = xmlMemBlocks();
        pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar17);
        pxVar26 = gen_xmlParserInputBufferPtr(uVar35,iVar17);
        uVar50 = 0xffffffff;
        uVar36 = (uint)pxVar28;
        if (uVar36 < 3) {
          uVar50 = *puVar53;
        }
        pxVar24 = pxVar26;
        lVar27 = xmlNewIOInputStream(pxVar19,pxVar26,uVar50);
        if (lVar27 == 0) {
          xmlFreeInputStream(0);
        }
        else {
          xmlFreeInputStream(lVar27);
          pxVar26 = (xmlParserInputBufferPtr)0x0;
        }
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlFreeParserInputBuffer(pxVar26);
        xmlResetLastError();
        iVar17 = xmlMemBlocks();
        if (iVar16 != iVar17) {
          iVar17 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewIOInputStream",(ulong)(uint)(iVar17 - iVar16));
          iVar15 = iVar15 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",(ulong)uVar35);
          printf(" %d");
          putchar(10);
          pxVar24 = pxVar28;
        }
        uVar36 = uVar36 + 1;
        pxVar28 = (xmlParserInputBufferPtr)(ulong)uVar36;
        puVar53 = puVar53 + 1;
      } while (uVar36 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 8);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  uVar21 = xmlNewParserCtxt();
  xmlFreeParserCtxt(uVar21);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    iVar18 = xmlMemBlocks();
    pxVar24 = (xmlParserInputBufferPtr)(ulong)(uint)(iVar18 - iVar16);
    printf("Leak of %d blocks found in xmlNewParserCtxt");
    putchar(10);
  }
  local_68 = (uint)(iVar16 != iVar17);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar40 = 0;
  do {
    local_58 = 0;
    bVar2 = true;
    do {
      bVar48 = bVar2;
      iVar16 = 0;
      do {
        uVar20 = 0;
        do {
          local_78 = &DAT_00165d70;
          uVar35 = 0;
          do {
            iVar18 = (int)pxVar24;
            iVar17 = xmlMemBlocks();
            pxVar23 = gen_xmlDocPtr(uVar40,iVar18);
            if (bVar48) {
              pxVar24 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
            }
            else {
              pxVar24 = (xmlParserInputBufferPtr)0x0;
            }
            piVar46 = &call_tests;
            if (iVar16 != 0) {
              if (iVar16 == 1) {
                piVar46 = (int *)0xffffffffffffffff;
              }
              else {
                piVar46 = (int *)0x0;
              }
            }
            uVar50 = 0xffffffff;
            if ((uint)uVar20 < 4) {
              uVar50 = (&DAT_0016343c)[uVar20];
            }
            if (uVar35 < 4) {
              uVar21 = *local_78;
            }
            else {
              uVar21 = 0;
            }
            pxVar28 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
            if (pxVar24 == pxVar28) {
              piVar46 = (int *)0x0;
            }
            xmlParseBalancedChunkMemory(pxVar23,pxVar24,piVar46,uVar50,uVar21,0);
            call_tests = call_tests + 1;
            if (((pxVar23 != (xmlDocPtr)0x0) && (api_doc != pxVar23)) && (pxVar23->doc != api_doc))
            {
              xmlFreeDoc(pxVar23);
            }
            xmlResetLastError();
            iVar18 = xmlMemBlocks();
            if (iVar17 != iVar18) {
              iVar18 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseBalancedChunkMemory",
                     (ulong)(uint)(iVar18 - iVar17));
              local_64 = local_64 + 1;
              printf(" %d",(ulong)uVar40);
              printf(" %d",local_58);
              printf(" %d",iVar16);
              printf(" %d",uVar20);
              printf(" %d");
              pxVar24 = (xmlParserInputBufferPtr)0x0;
              printf(" %d");
              putchar(10);
            }
            uVar35 = uVar35 + 1;
            local_78 = local_78 + 1;
          } while (uVar35 != 5);
          uVar35 = (uint)uVar20 + 1;
          uVar20 = (ulong)uVar35;
        } while (uVar35 != 4);
        iVar16 = iVar16 + 1;
      } while (iVar16 != 3);
      local_58 = 1;
      bVar2 = false;
    } while (bVar48);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  iVar3 = iVar47 + iVar3 + iVar6 + (int)local_90 + iVar4 + iVar5 + (uint)(iVar7 != iVar8) +
          (uint)(iVar9 != iVar10) + iVar11 + iVar12 + iVar13 + iVar14 + iVar15 + local_68;
  function_tests = function_tests + 1;
  iVar47 = 0;
  uVar40 = 0;
  do {
    local_68 = 0;
    bVar2 = true;
    do {
      bVar48 = bVar2;
      iVar4 = 0;
      do {
        uVar35 = 0;
        do {
          uVar20 = 0;
          do {
            local_90 = &DAT_0016343c;
            uVar36 = 0;
            do {
              uVar50 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
              iVar6 = (int)pxVar24;
              iVar5 = xmlMemBlocks();
              pxVar23 = gen_xmlDocPtr(uVar40,iVar6);
              if (bVar48) {
                pxVar24 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
              }
              else {
                pxVar24 = (xmlParserInputBufferPtr)0x0;
              }
              piVar46 = &call_tests;
              if (iVar4 != 0) {
                if (iVar4 == 1) {
                  piVar46 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar46 = (int *)0x0;
                }
              }
              uVar37 = 0xffffffff;
              if (uVar35 < 4) {
                uVar37 = (&DAT_0016343c)[uVar35];
              }
              if ((uint)uVar20 < 4) {
                uVar21 = (&DAT_00165d70)[uVar20];
              }
              else {
                uVar21 = 0;
              }
              uVar1 = *local_90;
              pxVar28 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
              if (pxVar24 == pxVar28) {
                piVar46 = (int *)0x0;
              }
              in_stack_ffffffffffffff68 = CONCAT44(uVar50,uVar1);
              xmlParseBalancedChunkMemoryRecover
                        (pxVar23,pxVar24,piVar46,uVar37,uVar21,0,in_stack_ffffffffffffff68);
              call_tests = call_tests + 1;
              if (((pxVar23 != (xmlDocPtr)0x0) && (api_doc != pxVar23)) && (pxVar23->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar23);
              }
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlParseBalancedChunkMemoryRecover",
                       (ulong)(uint)(iVar6 - iVar5));
                iVar47 = iVar47 + 1;
                printf(" %d",(ulong)uVar40);
                printf(" %d",(ulong)local_68);
                printf(" %d",iVar4);
                printf(" %d",(ulong)uVar35);
                printf(" %d",uVar20);
                printf(" %d",0);
                pxVar24 = (xmlParserInputBufferPtr)(ulong)uVar36;
                printf(" %d");
                putchar(10);
              }
              uVar36 = uVar36 + 1;
              local_90 = local_90 + 1;
            } while (uVar36 != 4);
            uVar36 = (uint)uVar20 + 1;
            uVar20 = (ulong)uVar36;
          } while (uVar36 != 5);
          uVar35 = uVar35 + 1;
        } while (uVar35 != 4);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 3);
      local_68 = 1;
      bVar2 = false;
    } while (bVar48);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  local_60._0_4_ = 0;
  uVar40 = 0;
  do {
    iVar4 = 0;
    do {
      uVar35 = 0;
      do {
        puVar53 = &DAT_0016343c;
        pxVar28 = (xmlParserInputBufferPtr)0x0;
        do {
          iVar5 = xmlMemBlocks();
          pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pxVar24);
          if (iVar4 == 0) {
            bVar2 = false;
            pcVar42 = "foo";
          }
          else if (iVar4 == 2) {
            bVar2 = false;
            pcVar42 = "test/ent2";
          }
          else if (iVar4 == 1) {
            bVar2 = false;
            pcVar42 = "<foo/>";
          }
          else {
            bVar2 = true;
            pcVar42 = (char *)0x0;
          }
          iVar6 = -1;
          if (uVar35 < 4) {
            iVar6 = (&DAT_0016343c)[uVar35];
          }
          uVar50 = *puVar53;
          iVar7 = (int)pxVar28;
          if ((bVar2) || (sVar22 = strlen(pcVar42), iVar6 <= (int)sVar22 + 1)) {
            xmlParseChunk(pxVar19,pcVar42,iVar6,uVar50);
            if (pxVar19 == (xmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
            }
            else {
              xmlFreeDoc(pxVar19->myDoc);
              pxVar19->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              xmlFreeParserCtxt(pxVar19);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            pxVar24 = (xmlParserInputBufferPtr)pcVar42;
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseChunk",(ulong)(uint)(iVar6 - iVar5));
              local_60._0_4_ = (int)local_60 + 1;
              printf(" %d",(ulong)uVar40);
              printf(" %d",iVar4);
              printf(" %d",(ulong)uVar35);
              printf(" %d");
              putchar(10);
              pxVar24 = pxVar28;
            }
          }
          uVar36 = iVar7 + 1;
          pxVar28 = (xmlParserInputBufferPtr)(ulong)uVar36;
          puVar53 = puVar53 + 1;
        } while (uVar36 != 4);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      uVar36 = 0;
      puVar45 = &DAT_00165d70;
      do {
        iVar6 = (int)pxVar24;
        iVar5 = xmlMemBlocks();
        pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar6);
        if (uVar35 < 4) {
          pxVar24 = (xmlParserInputBufferPtr)(&DAT_00165d70)[uVar35];
        }
        else {
          pxVar24 = (xmlParserInputBufferPtr)0x0;
        }
        if (uVar36 < 4) {
          uVar21 = *puVar45;
        }
        else {
          uVar21 = 0;
        }
        xmlParseCtxtExternalEntity(pxVar19,pxVar24,uVar21,0);
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseCtxtExternalEntity",
                 (ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",(ulong)uVar35);
          printf(" %d");
          pxVar24 = (xmlParserInputBufferPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar45 = puVar45 + 1;
      } while (uVar36 != 5);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 5);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar40 = 0;
  do {
    puVar45 = &DAT_00165d70;
    uVar35 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar21 = (&DAT_00165d70)[uVar40];
      }
      else {
        uVar21 = 0;
      }
      if (uVar35 < 4) {
        pxVar25 = (xmlNodePtr)*puVar45;
      }
      else {
        pxVar25 = (xmlNodePtr)0x0;
      }
      pxVar29 = (xmlNodePtr)xmlParseDTD(uVar21);
      desret_xmlNodePtr(pxVar29);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParseDTD",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar40);
        pxVar25 = (xmlNodePtr)(ulong)uVar35;
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar45 = puVar45 + 1;
    } while (uVar35 != 5);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 5);
  iVar47 = iVar3 + local_64 + iVar47 + (int)local_60;
  function_tests = function_tests + 1;
  puVar45 = &DAT_00165d70;
  uVar40 = 0;
  iVar3 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar40 < 4) {
      uVar21 = *puVar45;
    }
    else {
      uVar21 = 0;
    }
    pxVar23 = (xmlDocPtr)xmlParseDoc(uVar21);
    if (api_doc != pxVar23) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDoc",(ulong)(uint)(iVar7 - iVar6));
      iVar3 = iVar3 + 1;
      pxVar25 = (xmlNodePtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar40 != 5);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pxVar25);
    xmlParseDocument(pxVar19);
    if (pxVar19 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar19->myDoc);
      pxVar19->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDocument",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      pxVar25 = (xmlNodePtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar40 < 7) {
      uVar21 = *local_48;
    }
    else {
      uVar21 = 0;
    }
    pxVar23 = (xmlDocPtr)xmlParseEntity(uVar21);
    if (api_doc != pxVar23) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseEntity",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      pxVar25 = (xmlNodePtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    local_48 = local_48 + 1;
  } while (uVar40 != 8);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)pxVar25);
    xmlParseExtParsedEnt(pxVar19);
    if (pxVar19 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar19->myDoc);
      pxVar19->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseExtParsedEnt",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      pxVar25 = (xmlNodePtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  local_60._0_4_ = 0;
  uVar40 = 0;
  do {
    local_70 = 0;
    bVar2 = true;
    do {
      bVar48 = bVar2;
      uVar20 = 0;
      do {
        uVar30 = 0;
        do {
          uVar39 = 0;
          do {
            puVar45 = &DAT_00165d70;
            uVar35 = 0;
            do {
              iVar10 = (int)pxVar25;
              iVar9 = xmlMemBlocks();
              pxVar23 = gen_xmlDocPtr(uVar40,iVar10);
              if (bVar48) {
                pxVar25 = (xmlNodePtr)__xmlDefaultSAXHandler();
              }
              else {
                pxVar25 = (xmlNodePtr)0x0;
              }
              piVar46 = &call_tests;
              iVar10 = (int)uVar20;
              if (iVar10 != 0) {
                if (iVar10 == 1) {
                  piVar46 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar46 = (int *)0x0;
                }
              }
              uVar50 = 0xffffffff;
              if ((uint)uVar30 < 4) {
                uVar50 = (&DAT_0016343c)[uVar30];
              }
              if ((uint)uVar39 < 4) {
                uVar21 = (&DAT_00165d70)[uVar39];
              }
              else {
                uVar21 = 0;
              }
              if (uVar35 < 4) {
                uVar32 = *puVar45;
              }
              else {
                uVar32 = 0;
              }
              xmlParseExternalEntity(pxVar23,pxVar25,piVar46,uVar50,uVar21,uVar32,0);
              call_tests = call_tests + 1;
              if (((pxVar23 != (xmlDocPtr)0x0) && (api_doc != pxVar23)) && (pxVar23->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar23);
              }
              xmlResetLastError();
              iVar11 = xmlMemBlocks();
              if (iVar9 != iVar11) {
                iVar11 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlParseExternalEntity",
                       (ulong)(uint)(iVar11 - iVar9));
                local_60._0_4_ = (int)local_60 + 1;
                printf(" %d",(ulong)uVar40);
                printf(" %d",local_70);
                printf(" %d",uVar20);
                printf(" %d",uVar30);
                printf(" %d",uVar39);
                printf(" %d");
                pxVar25 = (xmlNodePtr)0x0;
                printf(" %d");
                putchar(10);
              }
              uVar35 = uVar35 + 1;
              puVar45 = puVar45 + 1;
            } while (uVar35 != 5);
            uVar35 = (uint)uVar39 + 1;
            uVar39 = (ulong)uVar35;
          } while (uVar35 != 5);
          uVar35 = (uint)uVar30 + 1;
          uVar30 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar20 = (ulong)(iVar10 + 1U);
      } while (iVar10 + 1U != 3);
      local_70 = 1;
      bVar2 = false;
    } while (bVar48);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  puVar45 = &DAT_00165d90;
  uVar40 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar40 < 7) {
      uVar21 = *puVar45;
    }
    else {
      uVar21 = 0;
    }
    pxVar23 = (xmlDocPtr)xmlParseFile(uVar21);
    if (api_doc != pxVar23) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseFile",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      pxVar25 = (xmlNodePtr)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar40 != 8);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      uVar20 = 0;
      do {
        puVar53 = &DAT_0016342c;
        uVar36 = 0;
        do {
          iVar12 = (int)pxVar25;
          iVar11 = xmlMemBlocks();
          pxVar25 = gen_xmlNodePtr(uVar40,iVar12);
          if (uVar35 < 3) {
            uVar21 = (&DAT_00165d58)[uVar35];
          }
          else {
            uVar21 = 0;
          }
          uVar50 = 0xffffffff;
          if ((uint)uVar20 < 4) {
            uVar50 = (&DAT_0016343c)[uVar20];
          }
          uVar37 = 0x200;
          if (uVar36 < 4) {
            uVar37 = *puVar53;
          }
          xmlParseInNodeContext(pxVar25,uVar21,uVar50,uVar37,0);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar40,pxVar25,nr);
          xmlResetLastError();
          iVar12 = xmlMemBlocks();
          if (iVar11 != iVar12) {
            iVar12 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParseInNodeContext",(ulong)(uint)(iVar12 - iVar11)
                  );
            iVar10 = iVar10 + 1;
            printf(" %d",(ulong)uVar40);
            printf(" %d",(ulong)uVar35);
            printf(" %d",uVar20);
            printf(" %d");
            pxVar25 = (xmlNodePtr)0x0;
            printf(" %d");
            putchar(10);
          }
          uVar36 = uVar36 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar36 != 5);
        uVar36 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar36;
      } while (uVar36 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  local_90._0_4_ = 0;
  uVar40 = 0;
  do {
    puVar38 = &DAT_0016343c;
    pxVar29 = (xmlNodePtr)0x0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar40 == 0) {
        bVar2 = false;
        pcVar42 = "foo";
      }
      else if (uVar40 == 2) {
        bVar2 = false;
        pcVar42 = "test/ent2";
      }
      else if (uVar40 == 1) {
        bVar2 = false;
        pcVar42 = "<foo/>";
      }
      else {
        bVar2 = true;
        pcVar42 = (char *)0x0;
      }
      uVar35 = *puVar38;
      iVar12 = (int)pxVar29;
      if ((bVar2) || (sVar22 = strlen(pcVar42), (int)uVar35 <= (int)sVar22 + 1)) {
        pxVar25 = (xmlNodePtr)(ulong)uVar35;
        pxVar23 = (xmlDocPtr)xmlParseMemory(pcVar42);
        if (api_doc != pxVar23) {
          xmlFreeDoc(pxVar23);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar11 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseMemory",(ulong)(uint)(iVar13 - iVar11));
          local_90._0_4_ = (int)local_90 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d");
          putchar(10);
          pxVar25 = pxVar29;
        }
      }
      uVar35 = iVar12 + 1;
      pxVar29 = (xmlNodePtr)(ulong)uVar35;
      puVar38 = puVar38 + 1;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  iVar12 = 0;
  iVar11 = 0;
  do {
    iVar14 = (int)pxVar25;
    iVar13 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(iVar11,iVar14);
    pxVar25 = (xmlNodePtr)0x0;
    xmlParserAddNodeInfo(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserAddNodeInfo",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d");
      pxVar25 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  iVar47 = iVar9 + iVar10 + iVar47 + iVar4 + iVar5 + iVar3 + iVar6 + iVar7 + iVar8 + (int)local_60 +
           (int)local_90;
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlParserFindNodeInfo(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserFindNodeInfo",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlParserFindNodeInfoIndex(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserFindNodeInfoIndex",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar53 = &DAT_0016343c;
  uVar40 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    xmlParserInputGrow(0,*puVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserInputGrow",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar53 = puVar53 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  puVar53 = &DAT_0016343c;
  uVar40 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    xmlParserInputRead(0,*puVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserInputRead",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar53 = puVar53 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  uVar40 = 0;
  local_90._0_4_ = 0;
  do {
    iVar9 = xmlMemBlocks();
    xmlPedanticParserDefault();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPedanticParserDefault",(ulong)(uint)(iVar10 - iVar9));
      local_90._0_4_ = (int)local_90 + 1;
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  local_38 = &DAT_00165d70;
  local_40 = &DAT_00165d90;
  local_64 = 0;
  uVar40 = 0;
  do {
    uVar20 = 0;
    do {
      uVar35 = 0;
      do {
        puVar53 = &DAT_0016342c;
        uVar36 = 0;
        do {
          iVar9 = xmlMemBlocks();
          if (uVar40 < 4) {
            uVar21 = (&DAT_00165d70)[uVar40];
          }
          else {
            uVar21 = 0;
          }
          if ((uint)uVar20 < 7) {
            uVar32 = (&DAT_00165d90)[uVar20];
          }
          else {
            uVar32 = 0;
          }
          if (uVar35 < 3) {
            uVar34 = (&DAT_00165d58)[uVar35];
          }
          else {
            uVar34 = 0;
          }
          uVar50 = 0x200;
          if (uVar36 < 4) {
            uVar50 = *puVar53;
          }
          pxVar23 = (xmlDocPtr)xmlReadDoc(uVar21,uVar32,uVar34,uVar50);
          if (api_doc != pxVar23) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar10 = xmlMemBlocks();
          if (iVar9 != iVar10) {
            iVar10 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReadDoc",(ulong)(uint)(iVar10 - iVar9));
            local_64 = local_64 + 1;
            printf(" %d",(ulong)uVar40);
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar35);
            printf(" %d");
            putchar(10);
          }
          uVar36 = uVar36 + 1;
          puVar53 = puVar53 + 1;
        } while (uVar36 != 5);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      uVar35 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar35;
    } while (uVar35 != 8);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 5);
  function_tests = function_tests + 1;
  local_68 = 0;
  uVar40 = 0;
  do {
    uVar20 = 0;
    do {
      uVar35 = 0;
      puVar53 = &DAT_0016342c;
      do {
        iVar9 = xmlMemBlocks();
        if (uVar40 < 7) {
          uVar21 = (&DAT_00165d90)[uVar40];
        }
        else {
          uVar21 = 0;
        }
        if ((uint)uVar20 < 3) {
          uVar32 = (&DAT_00165d58)[uVar20];
        }
        else {
          uVar32 = 0;
        }
        uVar50 = 0x200;
        if (uVar35 < 4) {
          uVar50 = *puVar53;
        }
        pxVar23 = (xmlDocPtr)xmlReadFile(uVar21,uVar32,uVar50);
        if (api_doc != pxVar23) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReadFile",(ulong)(uint)(iVar10 - iVar9));
          local_68 = local_68 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
        }
        uVar35 = uVar35 + 1;
        puVar53 = puVar53 + 1;
      } while (uVar35 != 5);
      uVar35 = (uint)uVar20 + 1;
      uVar20 = (ulong)uVar35;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 8);
  iVar47 = iVar47 + iVar12 + (uint)(iVar3 != iVar4) + (uint)(iVar5 != iVar6) + iVar7 + iVar8 +
           (int)local_90;
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar4 = 0;
  do {
    uVar40 = 0;
    do {
      uVar20 = 0;
      do {
        uVar35 = 0;
        do {
          uVar30 = 0;
          puVar53 = &DAT_0016342c;
          do {
            iVar5 = xmlMemBlocks();
            if (iVar4 == 0) {
              bVar2 = false;
              pcVar42 = "foo";
            }
            else if (iVar4 == 2) {
              bVar2 = false;
              pcVar42 = "test/ent2";
            }
            else if (iVar4 == 1) {
              bVar2 = false;
              pcVar42 = "<foo/>";
            }
            else {
              bVar2 = true;
              pcVar42 = (char *)0x0;
            }
            iVar6 = -1;
            if (uVar40 < 4) {
              iVar6 = (&DAT_0016343c)[uVar40];
            }
            if ((uint)uVar20 < 7) {
              uVar21 = (&DAT_00165d90)[uVar20];
            }
            else {
              uVar21 = 0;
            }
            if (uVar35 < 3) {
              uVar32 = (&DAT_00165d58)[uVar35];
            }
            else {
              uVar32 = 0;
            }
            uVar50 = 0x200;
            if ((uint)uVar30 < 4) {
              uVar50 = *puVar53;
            }
            if ((bVar2) || (sVar22 = strlen(pcVar42), iVar6 <= (int)sVar22 + 1)) {
              pxVar23 = (xmlDocPtr)xmlReadMemory(pcVar42,iVar6,uVar21,uVar32,uVar50);
              if (api_doc != pxVar23) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReadMemory",(ulong)(uint)(iVar6 - iVar5));
                iVar3 = iVar3 + 1;
                printf(" %d",iVar4);
                printf(" %d",(ulong)uVar40);
                printf(" %d",uVar20);
                printf(" %d",(ulong)uVar35);
                printf(" %d",uVar30);
                putchar(10);
              }
            }
            uVar36 = (uint)uVar30 + 1;
            uVar30 = (ulong)uVar36;
            puVar53 = puVar53 + 1;
          } while (uVar36 != 5);
          uVar35 = uVar35 + 1;
        } while (uVar35 != 4);
        uVar35 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar35;
      } while (uVar35 != 8);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 4);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 4);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar40 < 4) {
      uVar21 = *local_38;
    }
    else {
      uVar21 = 0;
    }
    pxVar23 = (xmlDocPtr)xmlRecoverDoc(uVar21);
    if (api_doc != pxVar23) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRecoverDoc",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    local_38 = local_38 + 1;
  } while (uVar40 != 5);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar40 < 7) {
      uVar21 = *local_40;
    }
    else {
      uVar21 = 0;
    }
    pxVar23 = (xmlDocPtr)xmlRecoverFile(uVar21);
    if (api_doc != pxVar23) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRecoverFile",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    local_40 = local_40 + 1;
  } while (uVar40 != 8);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar40 = 0;
  do {
    piVar46 = &DAT_0016343c;
    uVar20 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar40 == 0) {
        bVar2 = false;
        pcVar42 = "foo";
      }
      else if (uVar40 == 2) {
        bVar2 = false;
        pcVar42 = "test/ent2";
      }
      else if (uVar40 == 1) {
        bVar2 = false;
        pcVar42 = "<foo/>";
      }
      else {
        bVar2 = true;
        pcVar42 = (char *)0x0;
      }
      iVar8 = *piVar46;
      if ((bVar2) || (sVar22 = strlen(pcVar42), iVar8 <= (int)sVar22 + 1)) {
        pxVar23 = (xmlDocPtr)xmlRecoverMemory(pcVar42,iVar8);
        if (api_doc != pxVar23) {
          xmlFreeDoc(pxVar23);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRecoverMemory",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",uVar20);
          putchar(10);
        }
      }
      uVar35 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar35;
      piVar46 = piVar46 + 1;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  iVar7 = 0;
  local_90 = (undefined4 *)0x0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    uVar40 = 0;
    do {
      uVar35 = 0;
      puVar45 = &DAT_00165d70;
      do {
        iVar8 = xmlMemBlocks();
        if (bVar48) {
          uVar21 = __xmlDefaultSAXHandler();
        }
        else {
          uVar21 = 0;
        }
        if (uVar40 < 4) {
          uVar32 = (&DAT_00165d70)[uVar40];
        }
        else {
          uVar32 = 0;
        }
        if (uVar35 < 4) {
          uVar34 = *puVar45;
        }
        else {
          uVar34 = 0;
        }
        pxVar25 = (xmlNodePtr)xmlSAXParseDTD(uVar21,uVar32,uVar34);
        desret_xmlNodePtr(pxVar25);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseDTD",(ulong)(uint)(iVar9 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d",local_90);
          printf(" %d",(ulong)uVar40);
          printf(" %d");
          putchar(10);
        }
        uVar35 = uVar35 + 1;
        puVar45 = puVar45 + 1;
      } while (uVar35 != 5);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 5);
    local_90 = (undefined4 *)0x1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar8 = 0;
  local_90 = (undefined4 *)0x0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    uVar40 = 0;
    do {
      puVar53 = &DAT_0016343c;
      iVar9 = 0;
      do {
        iVar10 = xmlMemBlocks();
        if (bVar48) {
          uVar21 = __xmlDefaultSAXHandler();
        }
        else {
          uVar21 = 0;
        }
        if (uVar40 < 4) {
          uVar32 = (&DAT_00165d70)[uVar40];
        }
        else {
          uVar32 = 0;
        }
        pxVar23 = (xmlDocPtr)xmlSAXParseDoc(uVar21,uVar32,*puVar53);
        if (api_doc != pxVar23) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseDoc",(ulong)(uint)(iVar11 - iVar10));
          iVar8 = iVar8 + 1;
          printf(" %d",local_90);
          printf(" %d",(ulong)uVar40);
          printf(" %d");
          putchar(10);
        }
        iVar9 = iVar9 + 1;
        puVar53 = puVar53 + 1;
      } while (iVar9 != 4);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 5);
    local_90 = (undefined4 *)0x1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar40 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    uVar35 = 0;
    puVar45 = &DAT_00165d90;
    do {
      iVar10 = xmlMemBlocks();
      if (bVar48) {
        uVar21 = __xmlDefaultSAXHandler();
      }
      else {
        uVar21 = 0;
      }
      if (uVar35 < 7) {
        uVar32 = *puVar45;
      }
      else {
        uVar32 = 0;
      }
      pxVar23 = (xmlDocPtr)xmlSAXParseEntity(uVar21,uVar32);
      if (api_doc != pxVar23) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAXParseEntity",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar40);
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar45 = puVar45 + 1;
    } while (uVar35 != 8);
    uVar40 = 1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  local_78._0_4_ = 0;
  local_90 = (undefined4 *)0x0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    uVar40 = 0;
    do {
      puVar53 = &DAT_0016343c;
      iVar10 = 0;
      do {
        iVar11 = xmlMemBlocks();
        if (bVar48) {
          uVar21 = __xmlDefaultSAXHandler();
        }
        else {
          uVar21 = 0;
        }
        if (uVar40 < 7) {
          uVar32 = (&DAT_00165d90)[uVar40];
        }
        else {
          uVar32 = 0;
        }
        pxVar23 = (xmlDocPtr)xmlSAXParseFile(uVar21,uVar32,*puVar53);
        if (api_doc != pxVar23) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar11 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseFile",(ulong)(uint)(iVar12 - iVar11));
          local_78._0_4_ = (int)local_78 + 1;
          printf(" %d",local_90);
          printf(" %d",(ulong)uVar40);
          printf(" %d");
          putchar(10);
        }
        iVar10 = iVar10 + 1;
        puVar53 = puVar53 + 1;
      } while (iVar10 != 4);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 8);
    local_90 = (undefined4 *)0x1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar10 = 0;
  local_90 = (undefined4 *)0x0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    uVar40 = 0;
    do {
      uVar20 = 0;
      do {
        iVar11 = 0;
        do {
          iVar12 = xmlMemBlocks();
          if (bVar48) {
            uVar21 = __xmlDefaultSAXHandler();
          }
          else {
            uVar21 = 0;
          }
          if (uVar40 < 7) {
            uVar32 = (&DAT_00165d90)[uVar40];
          }
          else {
            uVar32 = 0;
          }
          uVar50 = 0xffffffff;
          if ((uint)uVar20 < 4) {
            uVar50 = (&DAT_0016343c)[uVar20];
          }
          piVar46 = &call_tests;
          if (iVar11 != 0) {
            if (iVar11 == 1) {
              piVar46 = (int *)0xffffffffffffffff;
            }
            else {
              piVar46 = (int *)0x0;
            }
          }
          pxVar23 = (xmlDocPtr)xmlSAXParseFileWithData(uVar21,uVar32,uVar50,piVar46);
          if (api_doc != pxVar23) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar12 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAXParseFileWithData",
                   (ulong)(uint)(iVar13 - iVar12));
            iVar10 = iVar10 + 1;
            printf(" %d",local_90);
            printf(" %d",(ulong)uVar40);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 3);
        uVar35 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar35;
      } while (uVar35 != 4);
      uVar40 = uVar40 + 1;
    } while (uVar40 != 8);
    local_90 = (undefined4 *)0x1;
    bVar2 = false;
  } while (bVar48);
  iVar47 = iVar4 + iVar5 + iVar47 + local_64 + local_68 + iVar3 + iVar6 + iVar7 + iVar8 + iVar9 +
           (int)local_78;
  function_tests = function_tests + 1;
  local_64 = 0;
  local_60 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar3 = 0;
    do {
      uVar40 = 0;
      do {
        uVar20 = 0;
        puVar53 = &DAT_0016343c;
        do {
          iVar4 = xmlMemBlocks();
          if (bVar48) {
            uVar21 = __xmlDefaultSAXHandler();
          }
          else {
            uVar21 = 0;
          }
          if (iVar3 == 0) {
            bVar2 = false;
            pcVar42 = "foo";
          }
          else if (iVar3 == 2) {
            bVar2 = false;
            pcVar42 = "test/ent2";
          }
          else if (iVar3 == 1) {
            bVar2 = false;
            pcVar42 = "<foo/>";
          }
          else {
            bVar2 = true;
            pcVar42 = (char *)0x0;
          }
          iVar5 = -1;
          if (uVar40 < 4) {
            iVar5 = (&DAT_0016343c)[uVar40];
          }
          uVar50 = *puVar53;
          if ((bVar2) || (sVar22 = strlen(pcVar42), iVar5 <= (int)sVar22 + 1)) {
            pxVar23 = (xmlDocPtr)xmlSAXParseMemory(uVar21,pcVar42,iVar5,uVar50);
            if (api_doc != pxVar23) {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAXParseMemory",(ulong)(uint)(iVar5 - iVar4));
              local_64 = local_64 + 1;
              printf(" %d",local_60);
              printf(" %d",iVar3);
              printf(" %d",(ulong)uVar40);
              printf(" %d",uVar20);
              putchar(10);
            }
          }
          uVar35 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar35;
          puVar53 = puVar53 + 1;
        } while (uVar35 != 4);
        uVar40 = uVar40 + 1;
      } while (uVar40 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    local_60 = 1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar3 = 0;
  local_50 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar4 = 0;
    do {
      uVar20 = 0;
      do {
        uVar30 = 0;
        do {
          uVar39 = 0;
          do {
            iVar5 = xmlMemBlocks();
            if (bVar48) {
              uVar21 = __xmlDefaultSAXHandler();
            }
            else {
              uVar21 = 0;
            }
            if (iVar4 == 0) {
              bVar2 = false;
              pcVar42 = "foo";
            }
            else if (iVar4 == 2) {
              bVar2 = false;
              pcVar42 = "test/ent2";
            }
            else if (iVar4 == 1) {
              bVar2 = false;
              pcVar42 = "<foo/>";
            }
            else {
              bVar2 = true;
              pcVar42 = (char *)0x0;
            }
            uVar50 = 0xffffffff;
            iVar6 = -1;
            if ((uint)uVar20 < 4) {
              iVar6 = (&DAT_0016343c)[uVar20];
            }
            if ((uint)uVar30 < 4) {
              uVar50 = (&DAT_0016343c)[uVar30];
            }
            piVar46 = &call_tests;
            iVar7 = (int)uVar39;
            if (iVar7 != 0) {
              if (iVar7 == 1) {
                piVar46 = (int *)0xffffffffffffffff;
              }
              else {
                piVar46 = (int *)0x0;
              }
            }
            if ((bVar2) || (sVar22 = strlen(pcVar42), iVar6 <= (int)sVar22 + 1)) {
              pxVar23 = (xmlDocPtr)xmlSAXParseMemoryWithData(uVar21,pcVar42,iVar6,uVar50,piVar46);
              if (api_doc != pxVar23) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAXParseMemoryWithData",
                       (ulong)(uint)(iVar6 - iVar5));
                iVar3 = iVar3 + 1;
                printf(" %d",local_50);
                printf(" %d",iVar4);
                printf(" %d",uVar20);
                printf(" %d",uVar30);
                printf(" %d",uVar39);
                putchar(10);
              }
            }
            uVar39 = (ulong)(iVar7 + 1U);
          } while (iVar7 + 1U != 3);
          uVar40 = (uint)uVar30 + 1;
          uVar30 = (ulong)uVar40;
        } while (uVar40 != 4);
        uVar40 = (uint)uVar20 + 1;
        uVar20 = (ulong)uVar40;
      } while (uVar40 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    local_50 = 1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  local_70._0_4_ = 0;
  local_78 = (undefined8 *)0x0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar4 = 0;
    do {
      puVar45 = &DAT_00165d90;
      piVar46 = (int *)0x0;
      do {
        iVar5 = xmlMemBlocks();
        if (bVar48) {
          lVar27 = __xmlDefaultSAXHandler();
        }
        else {
          lVar27 = 0;
        }
        piVar41 = &call_tests;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar41 = (int *)0xffffffffffffffff;
          }
          else {
            piVar41 = (int *)0x0;
          }
        }
        uVar40 = (uint)piVar46;
        if (uVar40 < 7) {
          uVar21 = *puVar45;
        }
        else {
          uVar21 = 0;
        }
        lVar31 = __xmlDefaultSAXHandler();
        if (lVar27 == lVar31) {
          piVar41 = (int *)0x0;
        }
        xmlSAXUserParseFile(lVar27,piVar41,uVar21);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXUserParseFile",(ulong)(uint)(iVar6 - iVar5));
          local_70._0_4_ = (int)local_70 + 1;
          printf(" %d",local_78);
          printf(" %d",iVar4);
          printf(" %d");
          putchar(10);
          piVar41 = piVar46;
        }
        uVar40 = uVar40 + 1;
        piVar46 = (int *)(ulong)uVar40;
        puVar45 = puVar45 + 1;
      } while (uVar40 != 8);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    local_78 = (undefined8 *)0x1;
    bVar2 = false;
  } while (bVar48);
  function_tests = function_tests + 1;
  iVar4 = 0;
  local_60 = 0;
  bVar2 = true;
  do {
    bVar48 = bVar2;
    iVar5 = 0;
    do {
      uVar40 = 0;
      do {
        piVar43 = (int *)0x0;
        piVar46 = &DAT_0016343c;
        do {
          iVar6 = xmlMemBlocks();
          if (bVar48) {
            lVar27 = __xmlDefaultSAXHandler();
          }
          else {
            lVar27 = 0;
          }
          piVar52 = &call_tests;
          if (iVar5 != 0) {
            if (iVar5 == 1) {
              piVar52 = (int *)0xffffffffffffffff;
            }
            else {
              piVar52 = (int *)0x0;
            }
          }
          if (uVar40 == 0) {
            bVar2 = false;
            pcVar42 = "foo";
          }
          else if (uVar40 == 2) {
            bVar2 = false;
            pcVar42 = "test/ent2";
          }
          else if (uVar40 == 1) {
            bVar2 = false;
            pcVar42 = "<foo/>";
          }
          else {
            bVar2 = true;
            pcVar42 = (char *)0x0;
          }
          iVar7 = *piVar46;
          iVar8 = (int)piVar43;
          if ((bVar2) || (sVar22 = strlen(pcVar42), iVar7 <= (int)sVar22 + 1)) {
            lVar31 = __xmlDefaultSAXHandler();
            piVar41 = piVar52;
            if (lVar27 == lVar31) {
              piVar41 = (int *)0x0;
            }
            xmlSAXUserParseMemory(lVar27,piVar41,pcVar42,iVar7);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 != iVar7) {
              iVar7 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAXUserParseMemory",(ulong)(uint)(iVar7 - iVar6)
                    );
              iVar4 = iVar4 + 1;
              printf(" %d",local_60);
              printf(" %d",iVar5);
              printf(" %d",(ulong)uVar40);
              printf(" %d");
              putchar(10);
              piVar41 = piVar43;
            }
          }
          uVar35 = iVar8 + 1;
          piVar43 = (int *)(ulong)uVar35;
          piVar46 = piVar46 + 1;
        } while (uVar35 != 4);
        uVar40 = uVar40 + 1;
      } while (uVar40 != 4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    local_60 = 1;
    bVar2 = false;
  } while (bVar48);
  iVar5 = 0;
  function_tests = function_tests + 1;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      piVar46 = (int *)0x0;
      bVar2 = true;
      do {
        bVar48 = bVar2;
        iVar7 = (int)piVar41;
        iVar6 = xmlMemBlocks();
        pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar7);
        if (uVar35 < 3) {
          piVar41 = (int *)(&DAT_00165d58)[uVar35];
        }
        else {
          piVar41 = (int *)0x0;
        }
        xmlSetFeature(pxVar19,piVar41,0);
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetFeature",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",(ulong)uVar35);
          printf(" %d");
          putchar(10);
          piVar41 = piVar46;
        }
        piVar46 = (int *)0x1;
        bVar2 = false;
      } while (bVar48);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 4);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  local_90._0_4_ = 0;
  uVar40 = 0;
  do {
    uVar35 = 0;
    do {
      piVar46 = (int *)0x0;
      puVar45 = &DAT_00165d90;
      do {
        iVar7 = (int)piVar41;
        iVar6 = xmlMemBlocks();
        pxVar19 = gen_xmlParserCtxtPtr(uVar40,iVar7);
        if (uVar35 < 4) {
          piVar41 = (int *)(&DAT_00165d70)[uVar35];
        }
        else {
          piVar41 = (int *)0x0;
        }
        uVar36 = (uint)piVar46;
        if (uVar36 < 7) {
          uVar21 = *puVar45;
        }
        else {
          uVar21 = 0;
        }
        xmlSetupParserForBuffer(pxVar19,piVar41,uVar21);
        call_tests = call_tests + 1;
        if (pxVar19 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar19);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetupParserForBuffer",(ulong)(uint)(iVar7 - iVar6));
          local_90._0_4_ = (int)local_90 + 1;
          printf(" %d",(ulong)uVar40);
          printf(" %d",(ulong)uVar35);
          printf(" %d");
          putchar(10);
          piVar41 = piVar46;
        }
        uVar36 = uVar36 + 1;
        piVar46 = (int *)(ulong)uVar36;
        puVar45 = puVar45 + 1;
      } while (uVar36 != 8);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 5);
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  uVar40 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    pxVar19 = gen_xmlParserCtxtPtr(uVar40,(int)piVar41);
    xmlStopParser(pxVar19);
    call_tests = call_tests + 1;
    if (pxVar19 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar19);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStopParser",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      piVar41 = (int *)(ulong)uVar40;
      printf(" %d");
      putchar(10);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 != 3);
  function_tests = function_tests + 1;
  puVar53 = &DAT_0016343c;
  uVar40 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    xmlSubstituteEntitiesDefault(*puVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSubstituteEntitiesDefault",(ulong)(uint)(iVar9 - iVar8))
      ;
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar40);
      putchar(10);
    }
    uVar40 = uVar40 + 1;
    puVar53 = puVar53 + 1;
  } while (uVar40 != 4);
  function_tests = function_tests + 1;
  uVar40 = (int)local_90 + iVar6 +
           iVar3 + (int)local_70 + iVar47 + iVar10 + local_64 + iVar4 + iVar5 + iVar7;
  if (uVar40 != 0) {
    printf("Module parser: %d errors\n",(ulong)uVar40);
  }
  return uVar40;
}

Assistant:

static int
test_parser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parser : 61 of 70 functions ...\n");
    test_ret += test_xmlByteConsumed();
    test_ret += test_xmlClearNodeInfoSeq();
    test_ret += test_xmlClearParserCtxt();
    test_ret += test_xmlCreateDocParserCtxt();
    test_ret += test_xmlCreatePushParserCtxt();
    test_ret += test_xmlCtxtReadDoc();
    test_ret += test_xmlCtxtReadFile();
    test_ret += test_xmlCtxtReadMemory();
    test_ret += test_xmlCtxtReset();
    test_ret += test_xmlCtxtResetPush();
    test_ret += test_xmlCtxtUseOptions();
    test_ret += test_xmlGetExternalEntityLoader();
    test_ret += test_xmlGetFeature();
    test_ret += test_xmlGetFeaturesList();
    test_ret += test_xmlHasFeature();
    test_ret += test_xmlIOParseDTD();
    test_ret += test_xmlInitNodeInfoSeq();
    test_ret += test_xmlInitParser();
    test_ret += test_xmlInitParserCtxt();
    test_ret += test_xmlKeepBlanksDefault();
    test_ret += test_xmlLineNumbersDefault();
    test_ret += test_xmlLoadExternalEntity();
    test_ret += test_xmlNewIOInputStream();
    test_ret += test_xmlNewParserCtxt();
    test_ret += test_xmlParseBalancedChunkMemory();
    test_ret += test_xmlParseBalancedChunkMemoryRecover();
    test_ret += test_xmlParseChunk();
    test_ret += test_xmlParseCtxtExternalEntity();
    test_ret += test_xmlParseDTD();
    test_ret += test_xmlParseDoc();
    test_ret += test_xmlParseDocument();
    test_ret += test_xmlParseEntity();
    test_ret += test_xmlParseExtParsedEnt();
    test_ret += test_xmlParseExternalEntity();
    test_ret += test_xmlParseFile();
    test_ret += test_xmlParseInNodeContext();
    test_ret += test_xmlParseMemory();
    test_ret += test_xmlParserAddNodeInfo();
    test_ret += test_xmlParserFindNodeInfo();
    test_ret += test_xmlParserFindNodeInfoIndex();
    test_ret += test_xmlParserInputGrow();
    test_ret += test_xmlParserInputRead();
    test_ret += test_xmlPedanticParserDefault();
    test_ret += test_xmlReadDoc();
    test_ret += test_xmlReadFile();
    test_ret += test_xmlReadMemory();
    test_ret += test_xmlRecoverDoc();
    test_ret += test_xmlRecoverFile();
    test_ret += test_xmlRecoverMemory();
    test_ret += test_xmlSAXParseDTD();
    test_ret += test_xmlSAXParseDoc();
    test_ret += test_xmlSAXParseEntity();
    test_ret += test_xmlSAXParseFile();
    test_ret += test_xmlSAXParseFileWithData();
    test_ret += test_xmlSAXParseMemory();
    test_ret += test_xmlSAXParseMemoryWithData();
    test_ret += test_xmlSAXUserParseFile();
    test_ret += test_xmlSAXUserParseMemory();
    test_ret += test_xmlSetExternalEntityLoader();
    test_ret += test_xmlSetFeature();
    test_ret += test_xmlSetupParserForBuffer();
    test_ret += test_xmlStopParser();
    test_ret += test_xmlSubstituteEntitiesDefault();

    if (test_ret != 0)
	printf("Module parser: %d errors\n", test_ret);
    return(test_ret);
}